

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Stress::anon_unknown_0::SingleBindingCase::renderTo
          (SingleBindingCase *this,Surface *dst)

{
  int iVar1;
  deUint32 dVar2;
  int height;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *log;
  PixelBufferAccess local_78;
  GLint local_4c;
  GLuint local_48;
  int colorUniformLoc;
  int colorLoc;
  GLuint local_34;
  undefined1 local_30 [4];
  int positionLoc;
  CallLogWrapper gl;
  Surface *dst_local;
  SingleBindingCase *this_local;
  
  gl._16_8_ = dst;
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  log = tcu::TestContext::getLog
                  ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_30,(Functions *)CONCAT44(extraout_var,iVar1),log);
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  local_34 = glu::CallLogWrapper::glGetAttribLocation((CallLogWrapper *)local_30,dVar2,"a_position")
  ;
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  local_48 = glu::CallLogWrapper::glGetAttribLocation((CallLogWrapper *)local_30,dVar2,"a_color");
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  local_4c = glu::CallLogWrapper::glGetUniformLocation((CallLogWrapper *)local_30,dVar2,"u_color");
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_30,true);
  glu::CallLogWrapper::glClearColor((CallLogWrapper *)local_30,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear((CallLogWrapper *)local_30,0x4000);
  iVar1 = tcu::Surface::getWidth((Surface *)gl._16_8_);
  height = tcu::Surface::getHeight((Surface *)gl._16_8_);
  glu::CallLogWrapper::glViewport((CallLogWrapper *)local_30,0,0,iVar1,height);
  glu::CallLogWrapper::glBindVertexArray
            ((CallLogWrapper *)local_30,(this->super_BindingRenderCase).m_vao);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"set vao",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x145);
  dVar2 = glu::ShaderProgram::getProgram((this->super_BindingRenderCase).m_program);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_30,dVar2);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x148);
  if (((this->m_spec).hasColorAttr & 1U) == 0) {
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)local_30,3,this->m_buf,(long)(this->m_spec).bufferOffset,
               (this->m_spec).bufferStride);
    glu::CallLogWrapper::glVertexAttribBinding((CallLogWrapper *)local_30,local_34,3);
    glu::CallLogWrapper::glVertexAttribFormat
              ((CallLogWrapper *)local_30,local_34,4,0x1406,'\0',(this->m_spec).positionAttrOffset);
    glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_30,local_34);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
    glu::checkError(GVar3,"set va",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                    ,0x162);
    glu::CallLogWrapper::glUniform4f((CallLogWrapper *)local_30,local_4c,0.0,1.0,0.0,1.0);
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)local_30,4,0,0x960);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
    glu::checkError(GVar3,"draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                    ,0x166);
  }
  else {
    glu::CallLogWrapper::glBindVertexBuffer
              ((CallLogWrapper *)local_30,3,this->m_buf,(long)(this->m_spec).bufferOffset,
               (this->m_spec).bufferStride);
    glu::CallLogWrapper::glVertexAttribBinding((CallLogWrapper *)local_30,local_34,3);
    glu::CallLogWrapper::glVertexAttribFormat
              ((CallLogWrapper *)local_30,local_34,4,0x1406,'\0',(this->m_spec).positionAttrOffset);
    glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_30,local_34);
    glu::CallLogWrapper::glVertexAttribBinding((CallLogWrapper *)local_30,local_48,3);
    glu::CallLogWrapper::glVertexAttribFormat
              ((CallLogWrapper *)local_30,local_48,4,0x1406,'\0',(this->m_spec).colorAttrOffset);
    glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_30,local_48);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
    glu::checkError(GVar3,"set va",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                    ,0x156);
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)local_30,4,0,0x960);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
    glu::checkError(GVar3,"draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                    ,0x159);
  }
  glu::CallLogWrapper::glFinish((CallLogWrapper *)local_30);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)local_30,0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_30,0);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_30);
  glu::checkError(GVar3,"clean",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x16c);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_BindingRenderCase).super_TestCase.m_context);
  tcu::Surface::getAccess(&local_78,(Surface *)gl._16_8_);
  glu::readPixels(pRVar4,0,0,&local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_30);
  return;
}

Assistant:

void SingleBindingCase::renderTo (tcu::Surface& dst)
{
	glu::CallLogWrapper gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const int			positionLoc		= gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	const int			colorLoc		= gl.glGetAttribLocation(m_program->getProgram(), "a_color");
	const int			colorUniformLoc	= gl.glGetUniformLocation(m_program->getProgram(), "u_color");

	gl.enableLogging(true);

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	gl.glViewport(0, 0, dst.getWidth(), dst.getHeight());
	gl.glBindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set vao");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	if (m_spec.hasColorAttr)
	{
		gl.glBindVertexBuffer(3, m_buf, m_spec.bufferOffset, m_spec.bufferStride);

		gl.glVertexAttribBinding(positionLoc, 3);
		gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, m_spec.positionAttrOffset);
		gl.glEnableVertexAttribArray(positionLoc);

		gl.glVertexAttribBinding(colorLoc, 3);
		gl.glVertexAttribFormat(colorLoc, 4, GL_FLOAT, GL_FALSE, m_spec.colorAttrOffset);
		gl.glEnableVertexAttribArray(colorLoc);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "set va");

		gl.glDrawArrays(GL_TRIANGLES, 0, GRID_SIZE*GRID_SIZE*6);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "draw");
	}
	else
	{
		gl.glBindVertexBuffer(3, m_buf, m_spec.bufferOffset, m_spec.bufferStride);
		gl.glVertexAttribBinding(positionLoc, 3);
		gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, m_spec.positionAttrOffset);
		gl.glEnableVertexAttribArray(positionLoc);

		GLU_EXPECT_NO_ERROR(gl.glGetError(), "set va");
		gl.glUniform4f(colorUniformLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		gl.glDrawArrays(GL_TRIANGLES, 0, GRID_SIZE*GRID_SIZE*6);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "draw");
	}

	gl.glFinish();
	gl.glBindVertexArray(0);
	gl.glUseProgram(0);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "clean");

	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}